

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O1

Expression * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::getRemappedType
          (ConvertComplexRemapTypes *this,Context *context,bool is32Bit,size_t vectorSize,
          size_t arraySize,bool isReference,bool isConst)

{
  StructurePtr o;
  ConcreteType *pCVar1;
  Type local_50;
  Type local_38;
  
  getComplexType(&local_50,this,context,is32Bit,vectorSize);
  if (arraySize != 0) {
    Type::createArray(&local_38,&local_50,arraySize);
    o.object = local_50.structure.object;
    local_50.category = local_38.category;
    local_50.arrayElementCategory = local_38.arrayElementCategory;
    local_50.isRef = local_38.isRef;
    local_50.isConstant = local_38.isConstant;
    local_50.primitiveType.type = local_38.primitiveType.type;
    local_50.boundingSize = local_38.boundingSize;
    local_50.arrayElementBoundingSize = local_38.arrayElementBoundingSize;
    if (local_38.structure.object != local_50.structure.object) {
      local_50.structure.object = local_38.structure.object;
      local_38.structure.object = (Structure *)0x0;
      RefCountedPtr<soul::Structure>::decIfNotNull(o.object);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_38.structure.object);
  }
  if (isReference) {
    if (local_50.isRef == true) {
      throwInternalCompilerError("! isReference()","createReference",0x19d);
    }
    if (local_50.structure.object != (Structure *)0x0) {
      ((local_50.structure.object)->super_RefCountedObject).refCount =
           ((local_50.structure.object)->super_RefCountedObject).refCount + 1;
    }
    local_50._0_8_ = local_50._0_8_ & 0xffffffffff00ffff | 0x10000;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_50.structure.object);
  }
  if (isConst) {
    if (local_50.isConstant == true) {
      throwInternalCompilerError("! isConst()","createConst",0x1a1);
    }
    if (local_50.structure.object != (Structure *)0x0) {
      ((local_50.structure.object)->super_RefCountedObject).refCount =
           ((local_50.structure.object)->super_RefCountedObject).refCount + 1;
    }
    local_50._0_8_ = local_50._0_8_ & 0xffffffff00ffffff | 0x1000000;
    RefCountedPtr<soul::Structure>::decIfNotNull(local_50.structure.object);
  }
  pCVar1 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type&>
                     (&this->allocator->pool,context,&local_50);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_50.structure.object);
  return &pCVar1->super_Expression;
}

Assistant:

AST::Expression& getRemappedType (AST::Context& context, bool is32Bit, size_t vectorSize, size_t arraySize, bool isReference, bool isConst)
        {
            auto complexType = getComplexType (context, is32Bit, vectorSize);

            if (arraySize != 0)
                complexType = complexType.createArray (arraySize);

            if (isReference)
                complexType = complexType.createReference();

            if (isConst)
                complexType = complexType.createConst();

            return allocator.allocate<AST::ConcreteType> (context, complexType);
        }